

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.cpp
# Opt level: O2

PropertyID lunasvg::propertyid(string_view *name)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  bool bVar1;
  PropertyID PVar2;
  difference_type __d;
  ulong uVar3;
  anon_struct_24_2_b8fd76e8 *paVar4;
  ulong uVar5;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  
  paVar4 = propertyid::table;
  uVar3 = 0x2f;
  while (uVar5 = uVar3, 0 < (long)uVar5) {
    uVar3 = uVar5 >> 1;
    __y._M_len = name->_M_len;
    __y._M_str = name->_M_str;
    __x_00._M_str = paVar4[uVar3].name._M_str;
    __x_00._M_len = paVar4[uVar3].name._M_len;
    bVar1 = std::operator<(__x_00,__y);
    if (bVar1) {
      paVar4 = paVar4 + uVar3 + 1;
      uVar3 = ~uVar3 + uVar5;
    }
  }
  if ((paVar4 != (anon_struct_24_2_b8fd76e8 *)&DAT_00155978) &&
     (__x._M_len = (paVar4->name)._M_len, __x._M_str = (paVar4->name)._M_str,
     __y_00._M_len = name->_M_len, __y_00._M_str = name->_M_str, bVar1 = std::operator!=(__x,__y_00)
     , !bVar1)) {
    return paVar4->value;
  }
  PVar2 = csspropertyid(name);
  return PVar2;
}

Assistant:

PropertyID propertyid(const std::string_view& name)
{
    static const struct {
        std::string_view name;
        PropertyID value;
    } table[] = {
        {"class", PropertyID::Class},
        {"clipPathUnits", PropertyID::ClipPathUnits},
        {"cx", PropertyID::Cx},
        {"cy", PropertyID::Cy},
        {"d", PropertyID::D},
        {"dx", PropertyID::Dx},
        {"dy", PropertyID::Dy},
        {"fx", PropertyID::Fx},
        {"fy", PropertyID::Fy},
        {"gradientTransform", PropertyID::GradientTransform},
        {"gradientUnits", PropertyID::GradientUnits},
        {"height", PropertyID::Height},
        {"href", PropertyID::Href},
        {"id", PropertyID::Id},
        {"lengthAdjust", PropertyID::LengthAdjust},
        {"markerHeight", PropertyID::MarkerHeight},
        {"markerUnits", PropertyID::MarkerUnits},
        {"markerWidth", PropertyID::MarkerWidth},
        {"maskContentUnits", PropertyID::MaskContentUnits},
        {"maskUnits", PropertyID::MaskUnits},
        {"offset", PropertyID::Offset},
        {"orient", PropertyID::Orient},
        {"patternContentUnits", PropertyID::PatternContentUnits},
        {"patternTransform", PropertyID::PatternTransform},
        {"patternUnits", PropertyID::PatternUnits},
        {"points", PropertyID::Points},
        {"preserveAspectRatio", PropertyID::PreserveAspectRatio},
        {"r", PropertyID::R},
        {"refX", PropertyID::RefX},
        {"refY", PropertyID::RefY},
        {"rotate", PropertyID::Rotate},
        {"rx", PropertyID::Rx},
        {"ry", PropertyID::Ry},
        {"spreadMethod", PropertyID::SpreadMethod},
        {"style", PropertyID::Style},
        {"textLength", PropertyID::TextLength},
        {"transform", PropertyID::Transform},
        {"viewBox", PropertyID::ViewBox},
        {"width", PropertyID::Width},
        {"x", PropertyID::X},
        {"x1", PropertyID::X1},
        {"x2", PropertyID::X2},
        {"xlink:href", PropertyID::Href},
        {"xml:space", PropertyID::WhiteSpace},
        {"y", PropertyID::Y},
        {"y1", PropertyID::Y1},
        {"y2", PropertyID::Y2}
    };

    auto it = std::lower_bound(table, std::end(table), name, [](const auto& item, const auto& name) { return item.name < name; });
    if(it == std::end(table) || it->name != name)
        return csspropertyid(name);
    return it->value;
}